

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  uint *key;
  int in_stack_00000034;
  string *in_stack_00000038;
  coda_cache<int,_int> *in_stack_00000040;
  string s_1;
  int *v_1;
  coda_cache<int,_int> cache_1;
  string s;
  int *v;
  coda_cache<int,_int> cache;
  size_t in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  uint uVar2;
  coda_cache<int,_int> *in_stack_fffffffffffffe20;
  uint local_1d4;
  int *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  uint local_19c;
  uint local_18c;
  uint local_17c;
  string local_160 [36];
  undefined4 local_13c;
  undefined4 local_138;
  undefined4 local_134;
  uint *local_130;
  undefined4 local_128;
  undefined4 local_124;
  undefined1 in_stack_ffffffffffffff0f;
  int *in_stack_ffffffffffffff10;
  int *in_stack_ffffffffffffff18;
  coda_cache<int,_int> *in_stack_ffffffffffffff20;
  string local_c0 [36];
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  uint *local_90;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_4;
  
  local_4 = 0;
  printf("Test 1: check that elements in cache with time_max == 0 do not expire\n");
  coda_cache<int,_int>::coda_cache
            (in_stack_fffffffffffffe20,CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18)
             ,in_stack_fffffffffffffe10);
  local_74 = 0;
  local_78 = 0x17;
  coda_cache<int,_int>::set
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             (bool)in_stack_ffffffffffffff0f);
  local_94 = 0;
  local_90 = (uint *)coda_cache<int,_int>::get
                               ((coda_cache<int,_int> *)
                                CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                                in_stack_fffffffffffffe30);
  if (local_90 == (uint *)0x0) {
    local_17c = 0;
  }
  else {
    local_17c = *local_90;
  }
  printf("right after insert got %d\n",(ulong)local_17c);
  sleep(1);
  local_98 = 0;
  local_90 = (uint *)coda_cache<int,_int>::get
                               ((coda_cache<int,_int> *)
                                CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                                in_stack_fffffffffffffe30);
  if (local_90 == (uint *)0x0) {
    local_18c = 0;
  }
  else {
    local_18c = *local_90;
  }
  printf("one second later got %d\n",(ulong)local_18c);
  sleep(3);
  local_9c = 0;
  local_90 = (uint *)coda_cache<int,_int>::get
                               ((coda_cache<int,_int> *)
                                CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                                in_stack_fffffffffffffe30);
  if (local_90 == (uint *)0x0) {
    local_19c = 0;
  }
  else {
    local_19c = *local_90;
  }
  printf("three more seconds later got %d\n",(ulong)local_19c);
  std::__cxx11::string::string(local_c0);
  coda_cache<int,_int>::dbg(in_stack_00000040,in_stack_00000038,in_stack_00000034);
  uVar1 = std::__cxx11::string::c_str();
  printf("dbg: %s\n",uVar1);
  std::__cxx11::string::~string(local_c0);
  coda_cache<int,_int>::~coda_cache((coda_cache<int,_int> *)0x10c6a9);
  printf("Test 2: check that elements in cache with time_max = 1 expire after one second\n");
  coda_cache<int,_int>::coda_cache
            (in_stack_fffffffffffffe20,CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18)
             ,in_stack_fffffffffffffe10);
  local_124 = 0;
  local_128 = 0x23;
  coda_cache<int,_int>::set
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             (bool)in_stack_ffffffffffffff0f);
  local_134 = 0;
  local_130 = (uint *)coda_cache<int,_int>::get
                                ((coda_cache<int,_int> *)
                                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                                 in_stack_fffffffffffffe30);
  if (local_130 == (uint *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = *local_130;
  }
  printf("right after insert got %d\n",(ulong)uVar2);
  sleep(1);
  local_138 = 0;
  key = (uint *)coda_cache<int,_int>::get
                          ((coda_cache<int,_int> *)CONCAT44(uVar2,in_stack_fffffffffffffe38),
                           in_stack_fffffffffffffe30);
  if (key == (uint *)0x0) {
    local_1d4 = 0;
  }
  else {
    local_1d4 = *key;
  }
  local_130 = key;
  printf("one second later got %d\n",(ulong)local_1d4);
  sleep(3);
  local_13c = 0;
  local_130 = (uint *)coda_cache<int,_int>::get
                                ((coda_cache<int,_int> *)CONCAT44(uVar2,in_stack_fffffffffffffe38),
                                 (int *)key);
  if (local_130 == (uint *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = *local_130;
  }
  printf("three more seconds later got %d\n",(ulong)uVar2);
  std::__cxx11::string::string(local_160);
  coda_cache<int,_int>::dbg(in_stack_00000040,in_stack_00000038,in_stack_00000034);
  uVar1 = std::__cxx11::string::c_str();
  printf("dbg: %s\n",uVar1);
  std::__cxx11::string::~string(local_160);
  coda_cache<int,_int>::~coda_cache((coda_cache<int,_int> *)0x10c8cb);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	/* TEST 1 */
	{
		printf("Test 1: check that elements in cache with time_max == 0 do not expire\n");

		coda_cache<int, int> cache (1024, 0);
		cache.set(0, 23, false);
		const int *v = cache.get(0);
		printf("right after insert got %d\n", (int) (v ? *v : 0));

		sleep(1);
		v = cache.get(0);
		printf("one second later got %d\n", (int) (v ? *v : 0));

		sleep(3);
		v = cache.get(0);
		printf("three more seconds later got %d\n", (int) (v ? *v : 0));

		std::string s;
		cache.dbg(s, 1);
		printf("dbg: %s\n", s.c_str());
	}

	/* TEST 2 */
	{
		printf("Test 2: check that elements in cache with time_max = 1 expire after one second\n");

		coda_cache<int, int> cache (1024, 1);
		cache.set(0, 35, false);
		const int *v = cache.get(0);
		printf("right after insert got %d\n", (int) (v ? *v : 0));

		sleep(1);
		v = cache.get(0);
		printf("one second later got %d\n", (int) (v ? *v : 0));

		sleep(3);
		v = cache.get(0);
		printf("three more seconds later got %d\n", (int) (v ? *v : 0));

		std::string s;
		cache.dbg(s, 1);
		printf("dbg: %s\n", s.c_str());
	}

#if 0
	coda_cache<int, int> cache (1024 * 1024, 86400);

	cache.set(0, 23, false);
	cache.set(1, 32, true);

	std::string dbg;
	cache.dbg(dbg, 1);

	printf("%s\n", dbg.c_str());

#if 1
	// std::vector<long double> v (5);
	std::string v = "12345";

	printf("%u\n", (unsigned) estimate_capacity(v));

	printf("sizeof(std::string)=%u\n", (unsigned) sizeof(std::string));
	printf("sizeof(std::vector<int>)=%u\n", (unsigned) sizeof(std::vector<int>));
	printf("sizeof(std::map<std::string,custom_type>)=%u\n", (unsigned) sizeof(std::map<std::string,custom_type>));
	printf("sizeof(std::map<std::string,custom_type>::value_type)=%u\n", (unsigned) sizeof(std::map<std::string,custom_type>::value_type));
	printf("sizeof(std::pair<std::string,custom_type>)=%u\n", (unsigned) sizeof(std::pair<std::string,custom_type>));
#endif
#endif

	return 0;
}